

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O0

bool ParseArgs(NodeContext *node,int argc,char **argv)

{
  bool bVar1;
  ArgsManager **ppAVar2;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  ArgsManager *args;
  optional<common::ConfigError> error_1;
  string error;
  undefined7 in_stack_fffffffffffffdf8;
  char in_stack_fffffffffffffdff;
  nullptr_t in_stack_fffffffffffffe00;
  undefined5 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  char *in_stack_fffffffffffffe28;
  ArgsManager *argsman;
  string *in_stack_fffffffffffffe30;
  bilingual_str *str;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  int local_1ac;
  byte local_171;
  _Alloc_hider in_stack_fffffffffffffeb0;
  char **in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  SettingsAbortFn *in_stack_fffffffffffffff0;
  ArgsManager *args_00;
  
  args_00 = *(ArgsManager **)(in_FS_OFFSET + 0x28);
  ppAVar2 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)
                       ,(char *)in_stack_fffffffffffffe30,
                       (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18);
  argsman = *ppAVar2;
  bVar1 = (bool)(**(code **)(**(long **)(in_RDI + 0x10) + 0x40))();
  SetupServerArgs(argsman,bVar1);
  std::__cxx11::string::string(in_stack_fffffffffffffe10);
  bVar1 = ArgsManager::ParseParameters
                    ((ArgsManager *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffeb8,(string *)in_stack_fffffffffffffeb0._M_p);
  if (bVar1) {
    str = (bilingual_str *)&stack0xfffffffffffffe90;
    std::
    function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function((function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)CONCAT17(in_stack_fffffffffffffe0f,
                           CONCAT16(in_stack_fffffffffffffe0e,
                                    CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))),
               in_stack_fffffffffffffe00);
    common::InitConfig(args_00,in_stack_fffffffffffffff0);
    std::
    function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function((function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<common::ConfigError> *)
                       CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    if (bVar1) {
      std::optional<common::ConfigError>::operator->
                ((optional<common::ConfigError> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      std::optional<common::ConfigError>::operator->
                ((optional<common::ConfigError> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      in_stack_fffffffffffffe27 =
           InitError(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)argsman);
      local_171 = in_stack_fffffffffffffe27;
    }
    std::optional<common::ConfigError>::~optional
              ((optional<common::ConfigError> *)
               CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    if (!bVar1) {
      for (local_1ac = 1; local_1ac < in_ESI; local_1ac = local_1ac + 1) {
        bVar1 = IsSwitchChar(in_stack_fffffffffffffdff);
        if (!bVar1) {
          tinyformat::format<char*>
                    ((char *)argsman,
                     (char **)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          Untranslated(&str->original);
          local_171 = InitError((bilingual_str *)
                                CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          goto LAB_00172434;
        }
      }
      local_171 = 1;
    }
  }
  else {
    tinyformat::format<std::__cxx11::string>
              (in_stack_fffffffffffffe28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    Untranslated(in_stack_fffffffffffffe30);
    local_171 = InitError((bilingual_str *)
                          CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  }
LAB_00172434:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  if (*(ArgsManager **)(in_FS_OFFSET + 0x28) != args_00) {
    __stack_chk_fail();
  }
  return (bool)(local_171 & 1);
}

Assistant:

static bool ParseArgs(NodeContext& node, int argc, char* argv[])
{
    ArgsManager& args{*Assert(node.args)};
    // If Qt is used, parameters/bitcoin.conf are parsed in qt/bitcoin.cpp's main()
    SetupServerArgs(args, node.init->canListenIpc());
    std::string error;
    if (!args.ParseParameters(argc, argv, error)) {
        return InitError(Untranslated(strprintf("Error parsing command line arguments: %s", error)));
    }

    if (auto error = common::InitConfig(args)) {
        return InitError(error->message, error->details);
    }

    // Error out when loose non-argument tokens are encountered on command line
    for (int i = 1; i < argc; i++) {
        if (!IsSwitchChar(argv[i][0])) {
            return InitError(Untranslated(strprintf("Command line contains unexpected token '%s', see bitcoind -h for a list of options.", argv[i])));
        }
    }
    return true;
}